

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode setup_range(Curl_easy *data)

{
  char *pcVar1;
  _Bool _Var2;
  long lVar3;
  
  lVar3 = (data->set).set_resume_from;
  (data->state).resume_from = lVar3;
  if ((lVar3 == 0) && ((data->set).str[0x17] == (char *)0x0)) {
    _Var2 = false;
  }
  else {
    if ((data->state).rangestringalloc == true) {
      (*Curl_cfree)((data->state).range);
      lVar3 = (data->state).resume_from;
    }
    if (lVar3 == 0) {
      pcVar1 = (*Curl_cstrdup)((data->set).str[0x17]);
    }
    else {
      pcVar1 = curl_maprintf("%ld-");
    }
    (data->state).range = pcVar1;
    _Var2 = true;
    (data->state).rangestringalloc = pcVar1 != (char *)0x0;
    if (pcVar1 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  (data->state).use_range = _Var2;
  return CURLE_OK;
}

Assistant:

static CURLcode setup_range(struct Curl_easy *data)
{
  struct UrlState *s = &data->state;
  s->resume_from = data->set.set_resume_from;
  if(s->resume_from || data->set.str[STRING_SET_RANGE]) {
    if(s->rangestringalloc)
      free(s->range);

    if(s->resume_from)
      s->range = aprintf("%" CURL_FORMAT_CURL_OFF_T "-", s->resume_from);
    else
      s->range = strdup(data->set.str[STRING_SET_RANGE]);

    s->rangestringalloc = (s->range) ? TRUE : FALSE;

    if(!s->range)
      return CURLE_OUT_OF_MEMORY;

    /* tell ourselves to fetch this range */
    s->use_range = TRUE;        /* enable range download */
  }
  else
    s->use_range = FALSE; /* disable range download */

  return CURLE_OK;
}